

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintpreviewwidget.cpp
# Opt level: O0

void __thiscall
QPrintPreviewWidgetPrivate::setCurrentPage(QPrintPreviewWidgetPrivate *this,int pageNumber)

{
  int iVar1;
  int iVar2;
  qsizetype qVar3;
  int in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  QScrollBar *vsc;
  QScrollBar *hsc;
  int lastPage;
  QPointF pt;
  qsizetype in_stack_ffffffffffffff38;
  QGraphicsItem *i;
  QList<QGraphicsItem_*> *in_stack_ffffffffffffff40;
  QPointF local_68;
  undefined1 local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((0 < in_ESI) &&
     (qVar3 = QList<QGraphicsItem_*>::size((QList<QGraphicsItem_*> *)(in_RDI + 0x288)),
     in_ESI <= qVar3)) {
    iVar1 = *(int *)(in_RDI + 0x268);
    *(int *)(in_RDI + 0x268) = in_ESI;
    if ((iVar1 != *(int *)(in_RDI + 0x268)) &&
       ((0 < iVar1 &&
        (qVar3 = QList<QGraphicsItem_*>::size((QList<QGraphicsItem_*> *)(in_RDI + 0x288)),
        iVar1 <= qVar3)))) {
      if (*(int *)(in_RDI + 0x2a4) == 2) {
        i = *(QGraphicsItem **)(in_RDI + 600);
        QList<QGraphicsItem_*>::at(in_stack_ffffffffffffff40,(qsizetype)i);
        QGraphicsView::centerOn(i);
      }
      else {
        iVar1 = QAbstractScrollArea::horizontalScrollBar();
        iVar2 = QAbstractScrollArea::verticalScrollBar();
        local_68.xp = -NAN;
        local_68.yp = -NAN;
        QGraphicsView::transform();
        QList<QGraphicsItem_*>::at(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        QGraphicsItem::pos();
        local_68.xp = (qreal)QTransform::map((QPointF *)local_58);
        QPointF::y(&local_68);
        QAbstractSlider::setValue(iVar2);
        QPointF::x(&local_68);
        QAbstractSlider::setValue(iVar1);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPrintPreviewWidgetPrivate::setCurrentPage(int pageNumber)
{
    if (pageNumber < 1 || pageNumber > pages.size())
        return;

    int lastPage = curPage;
    curPage = pageNumber;

    if (lastPage != curPage && lastPage > 0 && lastPage <= pages.size()) {
        if (zoomMode != QPrintPreviewWidget::FitInView) {
            QScrollBar *hsc = graphicsView->horizontalScrollBar();
            QScrollBar *vsc = graphicsView->verticalScrollBar();
            QPointF pt = graphicsView->transform().map(pages.at(curPage-1)->pos());
            vsc->setValue(int(pt.y()) - 10);
            hsc->setValue(int(pt.x()) - 10);
        } else {
            graphicsView->centerOn(pages.at(curPage-1));
        }
    }
}